

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O2

Vector3f __thiscall
pbrt::TrowbridgeReitzDistribution::Sample_wm
          (TrowbridgeReitzDistribution *this,Vector3f *wo,Point2f *u)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar6 [56];
  undefined1 auVar5 [64];
  Vector3<float> VVar7;
  Vector3f VVar8;
  Tuple3<pbrt::Vector3,_float> local_20;
  ulong uVar4;
  
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar6 = ZEXT856(0);
  if (0.0 <= fVar1) {
    local_20.z = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
    local_20.x = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
    local_20.y = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  }
  else {
    VVar7 = Tuple3<pbrt::Vector3,_float>::operator-(&wo->super_Tuple3<pbrt::Vector3,_float>);
    local_20.z = VVar7.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar7.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    local_20._0_8_ = vmovlps_avx(auVar5._0_16_);
  }
  VVar8 = SampleTrowbridgeReitzVisibleArea((Vector3f *)&local_20,this->alpha_x,this->alpha_y,u);
  uVar4 = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT816(0) << 0x40,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  if (fVar1 < 0.0) {
    uVar4 = uVar4 ^ 0x8000000080000000;
  }
  VVar8.super_Tuple3<pbrt::Vector3,_float>.z =
       (float)((uint)bVar3 * (int)-VVar8.super_Tuple3<pbrt::Vector3,_float>.z +
              (uint)!bVar3 * (int)VVar8.super_Tuple3<pbrt::Vector3,_float>.z);
  VVar8.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  VVar8.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar4 >> 0x20);
  return (Vector3f)VVar8.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f Sample_wm(const Vector3f &wo, const Point2f &u) const {
        bool flip = wo.z < 0;
        Vector3f wm =
            SampleTrowbridgeReitzVisibleArea(flip ? -wo : wo, alpha_x, alpha_y, u);
        if (flip)
            wm = -wm;
        return wm;
    }